

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  byte bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  SSL_SESSION *local_60;
  void *old_ssl_sessionid;
  int local_50;
  int iStack_4c;
  _Bool incache;
  int sockindex_idx;
  int connectdata_idx;
  curl_socket_t *sockindex_ptr;
  Curl_easy *pCStack_38;
  int sockindex;
  Curl_easy *data;
  connectdata *conn;
  SSL_SESSION *pSStack_20;
  int res;
  SSL_SESSION *ssl_sessionid_local;
  SSL *ssl_local;
  
  conn._4_4_ = 0;
  pSStack_20 = ssl_sessionid;
  ssl_sessionid_local = (SSL_SESSION *)ssl;
  iStack_4c = ossl_get_ssl_conn_index();
  local_50 = ossl_get_ssl_sockindex_index();
  if ((iStack_4c < 0) || (local_50 < 0)) {
    ssl_local._4_4_ = 0;
  }
  else {
    data = (Curl_easy *)SSL_get_ex_data((SSL *)ssl_sessionid_local,iStack_4c);
    if (data == (Curl_easy *)0x0) {
      ssl_local._4_4_ = 0;
    }
    else {
      pCStack_38 = data->next;
      _sockindex_idx = SSL_get_ex_data((SSL *)ssl_sessionid_local,local_50);
      sockindex_ptr._4_4_ =
           (int)((long)_sockindex_idx - (long)((data->req).doh.probe[0].dohbuffer + 100) >> 2);
      if (((int)(data->req).offset == 2) &&
         (*(int *)((data->req).doh.probe[0].dohbuffer +
                  (long)(int)(uint)(*(int *)((data->req).doh.probe[0].dohbuffer + 0x68) != -1) *
                  0x18 + 0xcc) != 2)) {
        bVar1 = (pCStack_38->set).proxy_ssl.primary.field_0x48;
      }
      else {
        bVar1 = (pCStack_38->set).ssl.primary.field_0x48;
      }
      if ((bVar1 >> 3 & 1) != 0) {
        local_60 = (SSL_SESSION *)0x0;
        Curl_ssl_sessionid_lock((connectdata *)data);
        _Var2 = Curl_ssl_getsessionid
                          ((connectdata *)data,&local_60,(size_t *)0x0,sockindex_ptr._4_4_);
        old_ssl_sessionid._7_1_ = (_Var2 ^ 0xffU) & 1;
        if ((old_ssl_sessionid._7_1_ != 0) && (local_60 != pSStack_20)) {
          Curl_infof(pCStack_38,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid((connectdata *)data,local_60);
          old_ssl_sessionid._7_1_ = 0;
        }
        if (old_ssl_sessionid._7_1_ == 0) {
          CVar3 = Curl_ssl_addsessionid((connectdata *)data,pSStack_20,0,sockindex_ptr._4_4_);
          if (CVar3 == CURLE_OK) {
            conn._4_4_ = 1;
          }
          else {
            Curl_failf(pCStack_38,"failed to store ssl session");
          }
        }
        Curl_ssl_sessionid_unlock((connectdata *)data);
      }
      ssl_local._4_4_ = conn._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct connectdata *conn;
  struct Curl_easy *data;
  int sockindex;
  curl_socket_t *sockindex_ptr;
  int connectdata_idx = ossl_get_ssl_conn_index();
  int sockindex_idx = ossl_get_ssl_sockindex_index();

  if(connectdata_idx < 0 || sockindex_idx < 0)
    return 0;

  conn = (struct connectdata*) SSL_get_ex_data(ssl, connectdata_idx);
  if(!conn)
    return 0;

  data = conn->data;

  /* The sockindex has been stored as a pointer to an array element */
  sockindex_ptr = (curl_socket_t*) SSL_get_ex_data(ssl, sockindex_idx);
  sockindex = (int)(sockindex_ptr - conn->sock);

  if(SSL_SET_OPTION(primary.sessionid)) {
    bool incache;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(conn);
    incache = !(Curl_ssl_getsessionid(conn, &old_ssl_sessionid, NULL,
                                      sockindex));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing\n");
        Curl_ssl_delsessionid(conn, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(conn, ssl_sessionid,
                                      0 /* unknown size */, sockindex)) {
        /* the session has been put into the session cache */
        res = 1;
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(conn);
  }

  return res;
}